

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O3

int Test_SUNMatClone(SUNMatrix A,int myid)

{
  int iVar1;
  SUNMatrix A_00;
  char *__s;
  
  A_00 = SUNMatClone(A);
  if (A_00 == (SUNMatrix)0x0) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n",myid);
    puts("    After SUNMatClone, B == NULL \n ");
    return 1;
  }
  iVar1 = has_data(A_00);
  if (iVar1 == 0) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n",myid);
    __s = "    Matrix data == NULL \n ";
  }
  else {
    iVar1 = SUNMatCopy(A,A_00);
    if (iVar1 != 0) {
      printf(">>> FAILED test -- SUNMatCopy, Proc %d \n",myid);
      goto LAB_00103f0b;
    }
    iVar1 = check_matrix(A_00,A,2.220446049250313e-15);
    if (iVar1 == 0) {
      if ((myid == 0) && (puts("    PASSED test -- SUNMatClone "), print_time != 0)) {
        printf("    SUNMatClone Time: %22.15e \n \n",0);
      }
      SUNMatDestroy(A_00);
      return 0;
    }
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n",myid);
    __s = "    Failed SUNMatClone check \n ";
  }
  puts(__s);
LAB_00103f0b:
  SUNMatDestroy(A_00);
  return 1;
}

Assistant:

int Test_SUNMatClone(SUNMatrix A, int myid)
{
  int       failure;
  double    start_time, stop_time;
  realtype  tol=10*UNIT_ROUNDOFF;
  SUNMatrix B;

  /* clone vector */
  start_time = get_time();
  B = SUNMatClone(A);
  stop_time = get_time();

  /* check cloned matrix */
  if (B == NULL) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n", myid);
    printf("    After SUNMatClone, B == NULL \n \n");
    return(1);
  }

  /* check cloned matrix data */
  if (!has_data(B)) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n", myid);
    printf("    Matrix data == NULL \n \n");
    SUNMatDestroy(B);
    return(1);
  }

  failure = SUNMatCopy(A, B);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy, Proc %d \n", myid);
    SUNMatDestroy(B);
    return(1);
  }

  failure = check_matrix(B, A, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n", myid);
    printf("    Failed SUNMatClone check \n \n");
    SUNMatDestroy(B);
    return(1);
  }

  if (myid == 0) {
    printf("    PASSED test -- SUNMatClone \n");
    PRINT_TIME("    SUNMatClone Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return(0);
}